

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O2

unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> __thiscall
duckdb::ReservoirSample::GetChunk(ReservoirSample *this)

{
  unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true> *this_00;
  sel_t *psVar1;
  SamplingState SVar2;
  pointer pRVar3;
  idx_t iVar4;
  ulong uVar5;
  DataChunk *pDVar6;
  pointer pDVar7;
  ulong uVar8;
  ReservoirSample *in_RSI;
  idx_t i;
  ulong uVar9;
  pair<double,_unsigned_long> pVar10;
  templated_unique_single_t ret;
  SelectionVector ret_sel;
  vector<duckdb::LogicalType,_true> reservoir_types;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> local_70;
  idx_t local_68;
  SelectionVector local_60;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  if (((in_RSI->super_BlockingSample).destroyed == false) &&
     ((in_RSI->reservoir_chunk).
      super_unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>._M_t.
      super___uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>
      .super__Head_base<0UL,_duckdb::ReservoirChunk_*,_false>._M_head_impl != (ReservoirChunk *)0x0)
     ) {
    this_00 = &in_RSI->reservoir_chunk;
    pRVar3 = unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::
             operator->(this_00);
    if ((pRVar3->chunk).count != 0) {
      make_uniq<duckdb::DataChunk>();
      SelectionVector::SelectionVector(&local_60,0x800);
      iVar4 = GetActiveSampleCount(in_RSI);
      if (iVar4 == 0) {
        (this->super_BlockingSample)._vptr_BlockingSample = (_func_int **)0x0;
      }
      else {
        uVar8 = 0;
        uVar9 = iVar4 - 0x800;
        local_68 = 0x800;
        if (iVar4 < 0x800) {
          uVar9 = uVar8;
          local_68 = iVar4;
        }
        for (; uVar9 < iVar4; uVar9 = uVar9 + 1) {
          SVar2 = GetSamplingState(in_RSI);
          if (SVar2 == RANDOM) {
            psVar1 = (in_RSI->sel).sel_vector;
            uVar5 = uVar9;
            if (psVar1 != (sel_t *)0x0) {
              uVar5 = (ulong)psVar1[uVar9];
            }
          }
          else {
            pVar10 = BlockingSample::PopFromWeightQueue(&in_RSI->super_BlockingSample);
            psVar1 = (in_RSI->sel).sel_vector;
            uVar5 = pVar10.second;
            if (psVar1 != (sel_t *)0x0) {
              uVar5 = (ulong)psVar1[pVar10.second];
            }
          }
          *(int *)((long)local_60.sel_vector + uVar8) = (int)uVar5;
          in_RSI->sel_size = in_RSI->sel_size - 1;
          uVar8 = uVar8 + 4;
        }
        pDVar6 = &unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                  ::operator->(this_00)->chunk;
        DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&local_48,pDVar6);
        pDVar7 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                             *)&local_70);
        DataChunk::Initialize
                  (pDVar7,in_RSI->allocator,(vector<duckdb::LogicalType,_true> *)&local_48,0x800);
        pDVar7 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                             *)&local_70);
        pDVar6 = &unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                  ::operator->(this_00)->chunk;
        DataChunk::Slice(pDVar7,pDVar6,&local_60,local_68,0);
        pDVar7 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                             *)&local_70);
        pDVar7->count = local_68;
        (this->super_BlockingSample)._vptr_BlockingSample = (_func_int **)local_70._M_head_impl;
        local_70._M_head_impl = (DataChunk *)0x0;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48)
        ;
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_60.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      ::std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
                ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)&local_70
                );
      return (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>)this;
    }
  }
  (this->super_BlockingSample)._vptr_BlockingSample = (_func_int **)0x0;
  return (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)
         (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)this;
}

Assistant:

unique_ptr<DataChunk> ReservoirSample::GetChunk() {
	if (destroyed || !reservoir_chunk || Chunk().size() == 0) {
		return nullptr;
	}
	// cannot destory internal samples.
	auto ret = make_uniq<DataChunk>();

	SelectionVector ret_sel(STANDARD_VECTOR_SIZE);
	idx_t collected_samples = GetActiveSampleCount();

	if (collected_samples == 0) {
		return nullptr;
	}

	idx_t samples_remaining;
	idx_t return_chunk_size;
	if (collected_samples > STANDARD_VECTOR_SIZE) {
		samples_remaining = collected_samples - STANDARD_VECTOR_SIZE;
		return_chunk_size = STANDARD_VECTOR_SIZE;
	} else {
		samples_remaining = 0;
		return_chunk_size = collected_samples;
	}

	for (idx_t i = samples_remaining; i < collected_samples; i++) {
		// pop samples and reduce size of selection vector.
		if (GetSamplingState() == SamplingState::RESERVOIR) {
			auto top = PopFromWeightQueue();
			ret_sel.set_index(i - samples_remaining, sel.get_index(top.second));
		} else {
			ret_sel.set_index(i - samples_remaining, sel.get_index(i));
		}
		sel_size -= 1;
	}

	auto reservoir_types = Chunk().GetTypes();

	ret->Initialize(allocator, reservoir_types, STANDARD_VECTOR_SIZE);
	ret->Slice(Chunk(), ret_sel, return_chunk_size);
	ret->SetCardinality(return_chunk_size);
	return ret;
}